

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guard_builder.cpp
# Opt level: O0

void __thiscall
r_exec::ConstGuardBuilder::_build
          (ConstGuardBuilder *this,Code *mdl,uint16_t fwd_opcode,uint16_t bwd_opcode,uint16_t q0,
          uint16_t t0,uint16_t t1,uint16_t *write_index)

{
  uint16_t uVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  Atom local_7c [4];
  Atom local_78 [4];
  Atom local_74 [4];
  Atom local_70 [4];
  Atom local_6c [4];
  Atom local_68 [4];
  Atom local_64 [4];
  Atom local_60 [4];
  Atom local_5c [4];
  Atom local_58 [6];
  uint16_t local_52;
  Atom local_50 [6];
  uint16_t extent_index;
  Atom local_40 [4];
  uint16_t local_3c;
  uint16_t local_3a;
  uint16_t t5;
  long *plStack_38;
  uint16_t t4;
  Code *lhs;
  uint16_t q1;
  uint16_t t3;
  long *plStack_28;
  uint16_t t2;
  Code *rhs;
  uint16_t t0_local;
  uint16_t q0_local;
  uint16_t bwd_opcode_local;
  uint16_t fwd_opcode_local;
  Code *mdl_local;
  ConstGuardBuilder *this_local;
  
  rhs._0_2_ = t0;
  rhs._2_2_ = q0;
  rhs._4_2_ = bwd_opcode;
  rhs._6_2_ = fwd_opcode;
  _t0_local = mdl;
  mdl_local = (Code *)this;
  iVar2 = (*(mdl->super__Object)._vptr__Object[9])();
  plStack_28 = (long *)CONCAT44(extraout_var,iVar2);
  (**(code **)(*plStack_28 + 0x20))();
  lhs._6_2_ = r_code::Atom::asIndex();
  (**(code **)(*plStack_28 + 0x20))();
  lhs._4_2_ = r_code::Atom::asIndex();
  plVar3 = (long *)(**(code **)(*plStack_28 + 0x48))(plStack_28,0);
  (**(code **)(*plVar3 + 0x20))(plVar3,3);
  lhs._2_2_ = r_code::Atom::asIndex();
  iVar2 = (*(_t0_local->super__Object)._vptr__Object[9])(_t0_local,1);
  plStack_38 = (long *)CONCAT44(extraout_var_00,iVar2);
  (**(code **)(*plStack_38 + 0x20))(plStack_38,2);
  local_3a = r_code::Atom::asIndex();
  (**(code **)(*plStack_38 + 0x20))(plStack_38,3);
  local_3c = r_code::Atom::asIndex();
  *write_index = *write_index + 1;
  r_code::Atom::IPointer((ushort)local_40);
  iVar2 = (*(_t0_local->super__Object)._vptr__Object[4])(_t0_local,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar2),local_40);
  r_code::Atom::~Atom(local_40);
  r_code::Atom::Set((uchar)local_50);
  iVar2 = (*(_t0_local->super__Object)._vptr__Object[4])(_t0_local,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar2),local_50);
  r_code::Atom::~Atom(local_50);
  local_52 = *write_index + 3;
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,_t0_local,lhs._6_2_,(uint16_t)rhs,Opcodes::Add,
             (this->super_TimingGuardBuilder).period,write_index,&local_52);
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,_t0_local,lhs._4_2_,t1,Opcodes::Add,
             (this->super_TimingGuardBuilder).period,write_index,&local_52);
  local_52 = local_52 + 1;
  r_code::Atom::AssignmentPointer((uchar)local_58,lhs._2_2_ & 0xff);
  uVar1 = *write_index;
  *write_index = uVar1 + 1;
  iVar2 = (*(_t0_local->super__Object)._vptr__Object[4])(_t0_local,(ulong)(ushort)(uVar1 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar2),local_58);
  r_code::Atom::~Atom(local_58);
  r_code::Atom::Operator((ushort)local_5c,(uchar)rhs._6_2_);
  iVar2 = (*(_t0_local->super__Object)._vptr__Object[4])(_t0_local,(ulong)local_52);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar2),local_5c);
  r_code::Atom::~Atom(local_5c);
  r_code::Atom::VLPointer((ushort)local_60,rhs._2_2_);
  local_52 = local_52 + 1;
  iVar2 = (*(_t0_local->super__Object)._vptr__Object[4])(_t0_local,(ulong)local_52);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar2),local_60);
  r_code::Atom::~Atom(local_60);
  r_code::Atom::Float((float)this->constant);
  local_52 = local_52 + 1;
  iVar2 = (*(_t0_local->super__Object)._vptr__Object[4])(_t0_local,(ulong)local_52);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_06,iVar2),local_64);
  r_code::Atom::~Atom(local_64);
  local_52 = local_52 + 1;
  *write_index = local_52;
  *write_index = *write_index + 1;
  r_code::Atom::IPointer((ushort)local_68);
  iVar2 = (*(_t0_local->super__Object)._vptr__Object[4])(_t0_local,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_07,iVar2),local_68);
  r_code::Atom::~Atom(local_68);
  r_code::Atom::Set((uchar)local_6c);
  iVar2 = (*(_t0_local->super__Object)._vptr__Object[4])(_t0_local,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_08,iVar2),local_6c);
  r_code::Atom::~Atom(local_6c);
  local_52 = *write_index + 5;
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,_t0_local,(uint16_t)rhs,lhs._6_2_,Opcodes::Sub,
             (this->super_TimingGuardBuilder).period,write_index,&local_52);
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,_t0_local,t1,lhs._4_2_,Opcodes::Sub,
             (this->super_TimingGuardBuilder).period,write_index,&local_52);
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,_t0_local,local_3a,lhs._6_2_,Opcodes::Sub,this->offset,
             write_index,&local_52);
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,_t0_local,local_3c,lhs._4_2_,Opcodes::Sub,this->offset,
             write_index,&local_52);
  local_52 = local_52 + 1;
  r_code::Atom::AssignmentPointer((uchar)local_70,rhs._2_2_ & 0xff);
  uVar1 = *write_index;
  *write_index = uVar1 + 1;
  iVar2 = (*(_t0_local->super__Object)._vptr__Object[4])(_t0_local,(ulong)(ushort)(uVar1 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_09,iVar2),local_70);
  r_code::Atom::~Atom(local_70);
  r_code::Atom::Operator((ushort)local_74,(uchar)rhs._4_2_);
  iVar2 = (*(_t0_local->super__Object)._vptr__Object[4])(_t0_local,(ulong)local_52);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_10,iVar2),local_74);
  r_code::Atom::~Atom(local_74);
  r_code::Atom::VLPointer((ushort)local_78,lhs._2_2_);
  local_52 = local_52 + 1;
  iVar2 = (*(_t0_local->super__Object)._vptr__Object[4])(_t0_local,(ulong)local_52);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_11,iVar2),local_78);
  r_code::Atom::~Atom(local_78);
  r_code::Atom::Float((float)this->constant);
  local_52 = local_52 + 1;
  iVar2 = (*(_t0_local->super__Object)._vptr__Object[4])(_t0_local,(ulong)local_52);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_12,iVar2),local_7c);
  r_code::Atom::~Atom(local_7c);
  *write_index = local_52 + 1;
  return;
}

Assistant:

void ConstGuardBuilder::_build(Code *mdl, uint16_t fwd_opcode, uint16_t bwd_opcode, uint16_t q0, uint16_t t0, uint16_t t1, uint16_t &write_index) const
{
    Code *rhs = mdl->get_reference(1);
    uint16_t t2 = rhs->code(FACT_AFTER).asIndex();
    uint16_t t3 = rhs->code(FACT_BEFORE).asIndex();
    uint16_t q1 = rhs->get_reference(0)->code(MK_VAL_VALUE).asIndex();
    Code *lhs = mdl->get_reference(1);
    uint16_t t4 = lhs->code(FACT_AFTER).asIndex();
    uint16_t t5 = lhs->code(FACT_BEFORE).asIndex();
    mdl->code(MDL_FWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(3);
    uint16_t extent_index = write_index + 3;
    write_guard(mdl, t2, t0, Opcodes::Add, period, write_index, extent_index);
    write_guard(mdl, t3, t1, Opcodes::Add, period, write_index, extent_index);
    mdl->code(++write_index) = Atom::AssignmentPointer(q1, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(fwd_opcode, 2); // q1:(fwd_opcode q0 constant)
    mdl->code(++extent_index) = Atom::VLPointer(q0);
    mdl->code(++extent_index) = Atom::Float(constant);
    extent_index += 1;
    write_index = extent_index;
    mdl->code(MDL_BWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(5);
    extent_index = write_index + 5;
    write_guard(mdl, t0, t2, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, t1, t3, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, t4, t2, Opcodes::Sub, offset, write_index, extent_index);
    write_guard(mdl, t5, t3, Opcodes::Sub, offset, write_index, extent_index);
    mdl->code(++write_index) = Atom::AssignmentPointer(q0, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(bwd_opcode, 2); // q0:(bwd_opcode q1 constant)
    mdl->code(++extent_index) = Atom::VLPointer(q1);
    mdl->code(++extent_index) = Atom::Float(constant);
    extent_index += 1;
    write_index = extent_index;
}